

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationDeviceImpl.cpp
# Opt level: O2

void __thiscall
Diligent::SerializationDeviceImpl::~SerializationDeviceImpl(SerializationDeviceImpl *this)

{
  GLSLangUtils::FinalizeGlslang();
  std::array<Diligent::RefCntAutoPtr<Diligent::IRenderDevice>,_8UL>::~array(&this->m_RenderDevices);
  std::
  _Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
  ::~_Vector_base(&(this->m_ResourceBindings).
                   super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                 );
  MtlProperties::~MtlProperties(&this->m_MtlProps);
  std::unique_ptr<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>::~unique_ptr
            (&this->m_pVkDxCompiler);
  std::unique_ptr<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>::~unique_ptr
            (&this->m_pDxCompiler);
  RenderDeviceBase<Diligent::SerializationEngineImplTraits>::~RenderDeviceBase
            (&this->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>);
  return;
}

Assistant:

SerializationDeviceImpl::~SerializationDeviceImpl()
{
#if !DILIGENT_NO_GLSLANG
    GLSLangUtils::FinalizeGlslang();
#endif
}